

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QTime *time,QWidget *parent)

{
  byte bVar1;
  DateTimePickerPrivate *pDVar2;
  ConnectionType type;
  undefined1 local_98 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_88;
  code *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_60;
  code *local_58;
  undefined8 local_50;
  undefined1 local_48 [12];
  QTime local_3c;
  QSizePolicy local_38 [5];
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *parent_local;
  QTime *time_local;
  DateTimePicker *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)time;
  time_local = (QTime *)this;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_24.i);
  *(undefined ***)this = &PTR_metaObject_00258528;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_002586d8;
  pDVar2 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(pDVar2,this,QTime);
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  ::QScopedPointer(&this->d,pDVar2);
  QSizePolicy::QSizePolicy(local_38,Fixed,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy *)this);
  bVar1 = QTime::isValid();
  if ((bVar1 & 1) == 0) {
    QTime::QTime(&local_3c,0,0,0,0);
  }
  else {
    local_3c.mds = *(int *)parent_local;
  }
  setTime(this,&local_3c);
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  local_58 = Scroller::aboutToStart;
  local_50 = 0;
  local_70._8_8_ = _q_scrollAboutToStart;
  QStack_60.d = (ScrollerPrivate *)0x0;
  type = (ConnectionType)this;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_48,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::aboutToStart,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  local_80 = Scroller::scroll;
  local_78 = 0;
  local_98._8_8_ = _q_scroll;
  QStack_88.d = (ScrollerPrivate *)0x0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)local_70,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::scroll,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_98,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QTime & time, QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QTime ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	setTime( time.isValid() ? time : DATETIMEPICKER_TIME_MIN );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}